

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap_string.hpp
# Opt level: O0

void jsoncons::utility::heap_string_factory<char,_jsoncons::null_type,_std::allocator<char>_>::
     destroy(pointer ptr)

{
  char *__p;
  heap_string<char,_jsoncons::null_type,_std::allocator<char>_> *in_RDI;
  byte_allocator_type byte_alloc;
  size_t mem_size;
  char *p;
  char *q;
  heap_string_type *rawp;
  new_allocator<char> *in_stack_ffffffffffffffd0;
  
  if (in_RDI != (heap_string<char,_jsoncons::null_type,_std::allocator<char>_> *)0x0) {
    ext_traits::
    to_plain_pointer<jsoncons::utility::heap_string<char,jsoncons::null_type,std::allocator<char>>>
              (in_RDI);
    launder_cast<char*,jsoncons::utility::heap_string<char,jsoncons::null_type,std::allocator<char>>>
              ((heap_string<char,_jsoncons::null_type,_std::allocator<char>_> *)0x1f1cfe);
    __p = (char *)(ulong)in_RDI->align_pad_;
    aligned_size(in_RDI->length_);
    heap_string_base<jsoncons::null_type,_std::allocator<char>_>::get_allocator
              (&in_RDI->super_heap_string_base<jsoncons::null_type,_std::allocator<char>_>);
    std::allocator<char>::allocator((allocator *)&stack0xffffffffffffffd7);
    __gnu_cxx::new_allocator<char>::deallocate(in_stack_ffffffffffffffd0,__p,0x1f1d86);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  }
  return;
}

Assistant:

static void destroy(pointer ptr)
        {
            if (ptr != nullptr)
            {
                heap_string_type* rawp = ext_traits::to_plain_pointer(ptr);

                char* q = launder_cast<char*>(rawp);

                char* p = q - ptr->offset_;

                std::size_t mem_size = ptr->align_pad_ + aligned_size(ptr->length_*sizeof(char_type));
                byte_allocator_type byte_alloc(ptr->get_allocator());
                byte_alloc.deallocate(p,mem_size + ptr->offset_);
            }
        }